

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printMemRegImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  uint uVar4;
  _Bool _Var5;
  short sVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  char *fmt;
  uint uVar9;
  
  set_mem_access(MI,true);
  pMVar7 = MCInst_getOperand(MI,OpNo);
  _Var5 = MCOperand_isImm(pMVar7);
  if (_Var5) {
    pMVar7 = MCInst_getOperand(MI,OpNo);
    iVar8 = MCOperand_getImm(pMVar7);
    sVar6 = (short)iVar8;
    if (sVar6 != 0) {
      uVar9 = (uint)sVar6;
      if (sVar6 < 0) {
        uVar4 = -uVar9;
        if (uVar9 < 0xfffffff7) {
          fmt = "-0x%x";
        }
        else {
          fmt = "-%u";
        }
      }
      else {
        uVar4 = uVar9;
        if (uVar9 < 10) {
          fmt = "%u";
        }
        else {
          fmt = "0x%x";
        }
      }
      SStream_concat(O,fmt,(ulong)uVar4);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        bVar2 = (pcVar3->field_6).x86.addr_size;
        if (MI->csh->doing_mem == true) {
          *(uint *)(pcVar3->groups + (ulong)bVar2 * 0x10 + 0x22) = uVar9;
        }
        else {
          puVar1 = pcVar3->groups + (ulong)bVar2 * 0x10 + 0x1a;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          pcVar3 = MI->flat_insn->detail;
          *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.addr_size * 0x10 + 0x1e) = uVar9;
          puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
          *puVar1 = *puVar1 + '\x01';
        }
      }
    }
  }
  else {
    printOperand(MI,OpNo,O);
  }
  SStream_concat0(O,"(");
  pMVar7 = MCInst_getOperand(MI,OpNo + 1);
  uVar9 = MCOperand_getReg(pMVar7);
  if (uVar9 == 0x36) {
    SStream_concat0(O,"0");
  }
  else {
    printOperand(MI,OpNo + 1,O);
  }
  SStream_concat0(O,")");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printMemRegImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);

	printS16ImmOperand_Mem(MI, OpNo, O);

	SStream_concat0(O, "(");

	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo + 1)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo + 1, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}